

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

void __thiscall
LiteScript::_Type_ARRAY::Save
          (_Type_ARRAY *this,ostream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Array *this_00;
  uint uVar1;
  Object *pOVar2;
  char *pcVar3;
  ostream *poVar4;
  long *plVar5;
  uint uVar6;
  long in_R8;
  code *pcVar7;
  
  this_00 = (Array *)object->data;
  uVar1 = Array::UnamedCount(this_00);
  OStreamer::Write<unsigned_int>(stream,uVar1);
  uVar1 = Array::UnamedCount(this_00);
  for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    plVar5 = (long *)((long)(object->memory->arr)._M_elems + in_R8);
    pcVar7 = (code *)caller;
    if ((caller & 1) != 0) {
      pcVar7 = *(code **)(*plVar5 + -1 + caller);
    }
    Array::ConstantGet((Array *)&stack0xffffffffffffffc0,(uint)this_00);
    pOVar2 = Variable::operator->((Variable *)&stack0xffffffffffffffc0);
    (*pcVar7)(plVar5,stream,pOVar2->ID);
    Variable::~Variable((Variable *)&stack0xffffffffffffffc0);
  }
  uVar1 = Array::UnamedCount(this_00);
  OStreamer::Write<unsigned_int>(stream,uVar1);
  uVar1 = Array::NamedCount(this_00);
  for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    pcVar3 = Array::GetNamedKey(this_00,uVar6);
    poVar4 = std::operator<<(stream,pcVar3);
    std::operator<<(poVar4,'\0');
    plVar5 = (long *)((long)(object->memory->arr)._M_elems + in_R8);
    pcVar7 = (code *)caller;
    if ((caller & 1) != 0) {
      pcVar7 = *(code **)(*plVar5 + -1 + caller);
    }
    Array::GetNamedVariable((Array *)&stack0xffffffffffffffc0,(uint)this_00);
    pOVar2 = Variable::operator->((Variable *)&stack0xffffffffffffffc0);
    (*pcVar7)(plVar5,stream,pOVar2->ID);
    Variable::~Variable((Variable *)&stack0xffffffffffffffc0);
  }
  return;
}

Assistant:

void LiteScript::_Type_ARRAY::Save(std::ostream &stream, Object &object, bool (Memory::*caller)(std::ostream&, unsigned int)) const {
    Array& obj = object.GetData<Array>();
    OStreamer::Write<unsigned int>(stream, obj.UnamedCount());
    for (unsigned int i = 0, sz = obj.UnamedCount(); i < sz; i++)
        (object.memory.*caller)(stream, obj.ConstantGet(i)->ID);
    OStreamer::Write<unsigned int>(stream, obj.UnamedCount());
    for (unsigned int i = 0, sz = obj.NamedCount(); i < sz; i++) {
        stream << obj.GetNamedKey(i) << (uint8_t)0;
        (object.memory.*caller)(stream, obj.GetNamedVariable(i)->ID);
    }
}